

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_core_linux.c
# Opt level: O1

int os_core_linux_create_lockfile(char *path)

{
  int __fd;
  int iVar1;
  
  __fd = open(path,0x42,0x1c0);
  if (__fd != -1) {
    iVar1 = flock(__fd,6);
    if (iVar1 == 0) {
      return 0;
    }
    close(__fd);
  }
  return -1;
}

Assistant:

int
os_core_linux_create_lockfile(const char *path) {
  int lock_fd;

  /* create file for lock */
  lock_fd = open(path, O_RDWR | O_CREAT, S_IRWXU);
  if (lock_fd == -1) {
    return -1;
  }

  if (flock(lock_fd, LOCK_EX | LOCK_NB)) {
    close(lock_fd);
    return -1;
  }

  /* lock will be released when process ends */
  return 0;
}